

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O1

string * __thiscall
cpsm::str_join<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (string *__return_storage_ptr__,cpsm *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *xs,string_ref sep)

{
  long lVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  char *size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *data;
  unsigned_long *x;
  long lVar3;
  stringstream ss;
  stringstream asStack_1b8 [16];
  basic_ostream<char,_std::char_traits<char>_> local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  lVar3 = *(long *)this;
  lVar1 = *(long *)(this + 8);
  if (lVar3 != lVar1) {
    size = (char *)0x0;
    data = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    do {
      pbVar2 = boost::io::ostream_put<char,std::char_traits<char>>
                         (local_1a8,(char *)data,(size_t)size);
      std::ostream::_M_insert<unsigned_long>((ulong)pbVar2);
      lVar3 = lVar3 + 8;
      size = sep.ptr_;
      data = xs;
    } while (lVar3 != lVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string str_join(T const& xs, boost::string_ref const sep) {
  std::stringstream ss;
  boost::string_ref s;
  for (auto const& x : xs) {
    ss << s << x;
    s = sep;
  }
  return ss.str();
}